

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

void __thiscall CGL::Matrix4x4::operator+=(Matrix4x4 *this,Matrix4x4 *B)

{
  Vector4D *pVVar1;
  Vector4D *pVVar2;
  Matrix4x4 *in_RSI;
  Matrix4x4 *in_RDI;
  double *Bij;
  double *Aij;
  Matrix4x4 *A;
  
  pVVar1 = operator[](in_RSI,0);
  pVVar2 = operator[](in_RDI,0);
  Vector4D::operator+=(pVVar2,pVVar1);
  pVVar1 = operator[](in_RSI,1);
  pVVar2 = operator[](in_RDI,1);
  Vector4D::operator+=(pVVar2,pVVar1);
  pVVar1 = operator[](in_RSI,2);
  pVVar2 = operator[](in_RDI,2);
  Vector4D::operator+=(pVVar2,pVVar1);
  pVVar1 = operator[](in_RSI,3);
  pVVar2 = operator[](in_RDI,3);
  Vector4D::operator+=(pVVar2,pVVar1);
  return;
}

Assistant:

void Matrix4x4::operator+=(const Matrix4x4 &B) {

  Matrix4x4 &A(*this);
  double *Aij = (double *)&A;
  const double *Bij = (const double *)&B;

  A[0] += B[0];
  A[1] += B[1];
  A[2] += B[2];
  A[3] += B[3];
}